

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.cpp
# Opt level: O3

bool __thiscall spvtools::opt::Instruction::IsFoldable(Instruction *this)

{
  bool bVar1;
  InstructionFolder *pIVar2;
  vector<std::function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>
  *pvVar3;
  bool bVar4;
  
  bVar1 = IsFoldableByFoldScalar(this);
  bVar4 = true;
  if (!bVar1) {
    bVar1 = IsFoldableByFoldVector(this);
    if (!bVar1) {
      pIVar2 = IRContext::get_instruction_folder(this->context_);
      pvVar3 = ConstantFoldingRules::GetRulesForInstruction
                         ((pIVar2->const_folding_rules_)._M_t.
                          super___uniq_ptr_impl<spvtools::opt::ConstantFoldingRules,_std::default_delete<spvtools::opt::ConstantFoldingRules>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_spvtools::opt::ConstantFoldingRules_*,_std::default_delete<spvtools::opt::ConstantFoldingRules>_>
                          .super__Head_base<0UL,_spvtools::opt::ConstantFoldingRules_*,_false>.
                          _M_head_impl,this);
      bVar4 = (pvVar3->
              super__Vector_base<std::function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>
              )._M_impl.super__Vector_impl_data._M_start !=
              (pvVar3->
              super__Vector_base<std::function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>
              )._M_impl.super__Vector_impl_data._M_finish;
    }
  }
  return bVar4;
}

Assistant:

bool Instruction::IsFoldable() const {
  return IsFoldableByFoldScalar() || IsFoldableByFoldVector() ||
         context()->get_instruction_folder().HasConstFoldingRule(this);
}